

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syncprod.cc
# Opt level: O1

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
tchecker::syncprod::committed_processes
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          system_t *system,const_vloc_sptr_t *vloc)

{
  ulong *puVar1;
  uint id;
  pointer __s;
  pointer puVar2;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar3;
  pointer psVar4;
  uint *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  allocator<unsigned_long> local_31;
  
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (__return_storage_ptr__,
             ((long)(system->super_system_t).super_processes_t._procs_attributes.
                    super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(system->super_system_t).super_processes_t._procs_attributes.
                    super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,0,&local_31
            );
  __s = (__return_storage_ptr__->m_bits).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start;
  puVar2 = (__return_storage_ptr__->m_bits).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != puVar2) {
    memset(__s,0,(long)puVar2 - (long)__s & 0xfffffffffffffff8);
  }
  pmVar3 = vloc->_t;
  if (pmVar3 == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) {
    __assert_fail("_t != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                  ,0x1d0,
                  "T &tchecker::intrusive_shared_ptr_t<const tchecker::make_shared_t<tchecker::vloc_t>>::operator*() const [T = const tchecker::make_shared_t<tchecker::vloc_t>]"
                 );
  }
  uVar8 = (ulong)(pmVar3->super_vloc_t).super_loc_array_t.super_vloc_base_t.
                 super_array_capacity_t<unsigned_int>._capacity;
  if (uVar8 != 0) {
    lVar7 = 0;
    do {
      id = *(uint *)(&(pmVar3->super_vloc_t).super_loc_array_t._fam.field_0x0 + lVar7);
      uVar9 = (ulong)id;
      bVar6 = system_t::is_committed(system,id);
      if (bVar6) {
        psVar4 = (system->super_system_t).super_locs_t._locs.
                 super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(system->super_system_t).super_locs_t._locs.
                          super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4) <= uVar9)
        {
          __assert_fail("id < _locs.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/system/loc.hh"
                        ,0xc3,
                        "tchecker::system::loc_const_shared_ptr_t tchecker::system::locs_t::location(tchecker::loc_id_t) const"
                       );
        }
        puVar5 = &(psVar4[uVar9].
                   super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _pid;
        if (puVar5[1] != id) {
          __assert_fail("_locs[id]->id() == id",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/system/loc.hh"
                        ,0xc4,
                        "tchecker::system::loc_const_shared_ptr_t tchecker::system::locs_t::location(tchecker::loc_id_t) const"
                       );
        }
        this = psVar4[uVar9].super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
        if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          puVar1 = (__return_storage_ptr__->m_bits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + (*puVar5 >> 6);
          *puVar1 = *puVar1 | 1L << ((byte)*puVar5 & 0x3f);
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this->_M_use_count = this->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this->_M_use_count = this->_M_use_count + 1;
          }
          puVar1 = (__return_storage_ptr__->m_bits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + (*puVar5 >> 6);
          *puVar1 = *puVar1 | 1L << ((byte)*puVar5 & 0x3f);
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
        }
      }
      lVar7 = lVar7 + 4;
    } while (uVar8 << 2 != lVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::dynamic_bitset<> committed_processes(tchecker::syncprod::system_t const & system,
                                            tchecker::const_vloc_sptr_t const & vloc)
{
  boost::dynamic_bitset<> committed(system.processes_count());
  committed.reset();
  for (tchecker::loc_id_t id : *vloc)
    if (system.is_committed(id))
      committed[system.location(id)->pid()] = 1;
  return committed;
}